

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

Vec_Ptr_t * Dar_BalanceCone(Aig_Obj_t *pObj,Vec_Vec_t *vStore,int Level)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Vec_Ptr_t *vSuper;
  void **ppvVar4;
  undefined8 *puVar5;
  void *pvVar6;
  uint uVar7;
  Aig_Obj_t *pObj_00;
  int iVar8;
  long lVar9;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x7a,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x7b,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
  }
  if (vStore->nSize <= Level) {
    iVar1 = Level + 1;
    if (vStore->nCap <= Level) {
      if (vStore->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(vStore->pArray,(long)iVar1 << 3);
      }
      vStore->pArray = ppvVar4;
      vStore->nCap = iVar1;
    }
    iVar8 = vStore->nSize;
    lVar9 = (long)iVar8;
    if (iVar8 <= Level) {
      iVar8 = (Level - iVar8) + 1;
      do {
        puVar5 = (undefined8 *)malloc(0x10);
        *puVar5 = 0;
        puVar5[1] = 0;
        vStore->pArray[lVar9] = puVar5;
        lVar9 = lVar9 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    vStore->nSize = iVar1;
    if ((Level < 0) || (vStore->nSize <= Level)) goto LAB_00487b96;
    puVar3 = (uint *)vStore->pArray[(uint)Level];
    uVar2 = *puVar3;
    if (puVar3[1] == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x80);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar3 + 2),0x80);
        }
        *(void **)(puVar3 + 2) = pvVar6;
        uVar7 = 0x10;
      }
      else {
        uVar7 = uVar2 * 2;
        if ((int)uVar7 <= (int)uVar2) goto LAB_00487b2e;
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar6 = malloc((ulong)uVar2 << 4);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar3 + 2),(ulong)uVar2 << 4);
        }
        *(void **)(puVar3 + 2) = pvVar6;
      }
      *puVar3 = uVar7;
    }
LAB_00487b2e:
    uVar2 = puVar3[1];
    puVar3[1] = uVar2 + 1;
    *(undefined8 *)(*(long *)(puVar3 + 2) + (long)(int)uVar2 * 8) = 0;
  }
  if ((-1 < Level) && (Level < vStore->nSize)) {
    vSuper = (Vec_Ptr_t *)vStore->pArray[(uint)Level];
    vSuper->nSize = 0;
    pObj_00 = pObj;
    Dar_BalanceCone_rec(pObj,pObj,vSuper);
    Dar_BalanceUniqify(pObj_00,vSuper,(uint)((*(uint *)&pObj->field_0x18 & 7) == 6));
    return vSuper;
  }
LAB_00487b96:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

Vec_Ptr_t * Dar_BalanceCone( Aig_Obj_t * pObj, Vec_Vec_t * vStore, int Level )
{
    Vec_Ptr_t * vNodes;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // extend the storage
    if ( Vec_VecSize( vStore ) <= Level )
        Vec_VecPush( vStore, Level, 0 );
    // get the temporary array of nodes
    vNodes = Vec_VecEntry( vStore, Level );
    Vec_PtrClear( vNodes );
    // collect the nodes in the implication supergate
    Dar_BalanceCone_rec( pObj, pObj, vNodes );
    // remove duplicates
    Dar_BalanceUniqify( pObj, vNodes, Aig_ObjIsExor(pObj) );
    return vNodes;
}